

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmCnf.c
# Opt level: O3

void Sfm_TranslateCnf(Vec_Wec_t *vRes,Vec_Str_t *vCnf,Vec_Int_t *vFaninMap,int iPivotVar)

{
  int iVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  Vec_Int_t *pVVar4;
  int *piVar5;
  long lVar6;
  uint uVar7;
  int iVar9;
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  int iVar14;
  long lVar11;
  
  auVar3 = _DAT_0093d220;
  iVar1 = vRes->nSize;
  if (0 < (long)iVar1) {
    pVVar4 = vRes->pArray;
    lVar6 = (long)iVar1 + -1;
    auVar8._8_4_ = (int)lVar6;
    auVar8._0_8_ = lVar6;
    auVar8._12_4_ = (int)((ulong)lVar6 >> 0x20);
    lVar6 = 0;
    auVar8 = auVar8 ^ _DAT_0093d220;
    auVar10 = _DAT_0093e4e0;
    auVar12 = _DAT_0093d210;
    do {
      auVar13 = auVar12 ^ auVar3;
      iVar9 = auVar8._4_4_;
      if ((bool)(~(auVar13._4_4_ == iVar9 && auVar8._0_4_ < auVar13._0_4_ || iVar9 < auVar13._4_4_)
                & 1)) {
        *(undefined4 *)((long)&pVVar4->nSize + lVar6) = 0;
      }
      if ((auVar13._12_4_ != auVar8._12_4_ || auVar13._8_4_ <= auVar8._8_4_) &&
          auVar13._12_4_ <= auVar8._12_4_) {
        *(undefined4 *)((long)&pVVar4[1].nSize + lVar6) = 0;
      }
      auVar13 = auVar10 ^ auVar3;
      iVar14 = auVar13._4_4_;
      if (iVar14 <= iVar9 && (iVar14 != iVar9 || auVar13._0_4_ <= auVar8._0_4_)) {
        *(undefined4 *)((long)&pVVar4[2].nSize + lVar6) = 0;
        *(undefined4 *)((long)&pVVar4[3].nSize + lVar6) = 0;
      }
      lVar11 = auVar12._8_8_;
      auVar12._0_8_ = auVar12._0_8_ + 4;
      auVar12._8_8_ = lVar11 + 4;
      lVar11 = auVar10._8_8_;
      auVar10._0_8_ = auVar10._0_8_ + 4;
      auVar10._8_8_ = lVar11 + 4;
      lVar6 = lVar6 + 0x40;
    } while ((ulong)(iVar1 + 3U >> 2) << 6 != lVar6);
  }
  vRes->nSize = 0;
  pVVar4 = Vec_WecPushLevel(vRes);
  if (0 < vCnf->nSize) {
    lVar6 = 0;
    do {
      uVar7 = (uint)vCnf->pArray[lVar6];
      if (uVar7 == 0xffffffff) {
        pVVar4 = Vec_WecPushLevel(vRes);
      }
      else {
        if (vCnf->pArray[lVar6] < '\0') {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x134,"int Abc_Lit2LitV(int *, int)");
        }
        iVar1 = vFaninMap->pArray[uVar7 >> 1];
        if (iVar1 < 0) {
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
        uVar2 = pVVar4->nSize;
        if (uVar2 == pVVar4->nCap) {
          if ((int)uVar2 < 0x10) {
            if (pVVar4->pArray == (int *)0x0) {
              piVar5 = (int *)malloc(0x40);
            }
            else {
              piVar5 = (int *)realloc(pVVar4->pArray,0x40);
            }
            pVVar4->pArray = piVar5;
            if (piVar5 == (int *)0x0) {
LAB_008df53e:
              __assert_fail("p->pArray",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
            }
            pVVar4->nCap = 0x10;
          }
          else {
            if (pVVar4->pArray == (int *)0x0) {
              piVar5 = (int *)malloc((ulong)uVar2 * 8);
            }
            else {
              piVar5 = (int *)realloc(pVVar4->pArray,(ulong)uVar2 * 8);
            }
            pVVar4->pArray = piVar5;
            if (piVar5 == (int *)0x0) goto LAB_008df53e;
            pVVar4->nCap = uVar2 * 2;
          }
        }
        else {
          piVar5 = pVVar4->pArray;
        }
        iVar9 = pVVar4->nSize;
        pVVar4->nSize = iVar9 + 1;
        piVar5[iVar9] = (uint)(iVar1 == iPivotVar) ^ (uVar7 & 1) + iVar1 * 2;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < vCnf->nSize);
  }
  return;
}

Assistant:

void Sfm_TranslateCnf( Vec_Wec_t * vRes, Vec_Str_t * vCnf, Vec_Int_t * vFaninMap, int iPivotVar )
{
    Vec_Int_t * vClause;
    signed char Entry;
    int i, Lit;
    Vec_WecClear( vRes );
    vClause = Vec_WecPushLevel( vRes );
    Vec_StrForEachEntry( vCnf, Entry, i )
    {
        if ( (int)Entry == -1 )
        {
            vClause = Vec_WecPushLevel( vRes );
            continue;
        }
        Lit = Abc_Lit2LitV( Vec_IntArray(vFaninMap), (int)Entry );
        Lit = Abc_LitNotCond( Lit, Abc_Lit2Var(Lit) == iPivotVar );
        Vec_IntPush( vClause, Lit );
    }
}